

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::ContentSpecNode> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  ContentSpecNode *t;
  ContentSpecNode *serObj;
  ContentSpecNode *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::ContentSpecNode> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (ContentSpecNode *)
        BaseRefVectorOf<xercesc_4_0::ContentSpecNode>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::ContentSpecNode>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (ContentSpecNode *)0x0; data < t;
        data = (ContentSpecNode *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      serObj = BaseRefVectorOf<xercesc_4_0::ContentSpecNode>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::ContentSpecNode>,
                          (XMLSize_t)data);
      operator<<(serEng,&serObj->super_XSerializable);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<ContentSpecNode>* const objToStore
                                    , XSerializeEngine&                   serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            ContentSpecNode* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}